

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O0

int __thiscall MPEGStreamReader::readPacket(MPEGStreamReader *this,AVPacket *avPacket)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  uchar **ppuVar6;
  uint8_t *puVar7;
  uint8_t *puStack_80;
  int bytesProcessed;
  uint8_t *nal;
  uint8_t *local_70;
  uint8_t *findEnd;
  uint8_t *nal_2;
  int64_t iStack_58;
  int rez;
  int64_t prevDts;
  uint8_t *puStack_48;
  int isNal;
  uint8_t *local_40;
  uint8_t *nextNal;
  uint8_t *puStack_30;
  int bytesProcessed_1;
  uint8_t *nal_1;
  uint8_t *prevPos;
  AVPacket *avPacket_local;
  MPEGStreamReader *this_local;
  
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->flags = (this->super_AbstractStreamReader).m_flags;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  prevPos = (uint8_t *)avPacket;
  avPacket_local = (AVPacket *)this;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0xd])();
  *(undefined4 *)(prevPos + 0x48) = *(undefined4 *)CONCAT44(extraout_var,iVar4);
  prevPos[0x28] = '\0';
  prevPos[0x29] = '\0';
  prevPos[0x2a] = '\0';
  prevPos[0x2b] = '\0';
  prevPos[0x2c] = '\0';
  prevPos[0x2d] = '\0';
  prevPos[0x2e] = '\0';
  prevPos[0x2f] = '\0';
  prevPos[0x10] = '\0';
  prevPos[0x11] = '\0';
  prevPos[0x12] = '\0';
  prevPos[0x13] = '\0';
  prevPos[0x14] = '\0';
  prevPos[0x15] = '\0';
  prevPos[0x16] = '\0';
  prevPos[0x17] = '\0';
  prevPos[0x18] = '\0';
  prevPos[0x19] = '\0';
  prevPos[0x1a] = '\0';
  prevPos[0x1b] = '\0';
  *(int64_t *)prevPos = this->m_curPts + (this->super_AbstractStreamReader).m_timeOffset;
  lVar1 = this->m_curDts;
  lVar2 = (this->super_AbstractStreamReader).m_timeOffset;
  lVar3 = this->m_pcrIncPerFrame;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])();
  *(long *)(prevPos + 8) = (lVar1 + lVar2) - lVar3 * iVar4;
  nal_1 = (this->super_AbstractStreamReader).m_curPos;
  if ((this->m_syncToStream & 1U) == 0) {
    puStack_30 = NALUnit::findNALWithStartCode
                           ((this->super_AbstractStreamReader).m_curPos,
                            (this->super_AbstractStreamReader).m_bufEnd,
                            (bool)(this->m_longCodesAllowed & 1));
    if (puStack_30 == (this->super_AbstractStreamReader).m_bufEnd) {
      (this->super_AbstractStreamReader).m_curPos = (this->super_AbstractStreamReader).m_bufEnd;
    }
    else {
      this->m_syncToStream = true;
      (this->super_AbstractStreamReader).m_curPos = puStack_30;
    }
    nextNal._4_4_ = (int)(this->super_AbstractStreamReader).m_curPos - (int)nal_1;
    this->m_processedBytes = (long)nextNal._4_4_ + this->m_processedBytes;
    nal_1 = (this->super_AbstractStreamReader).m_curPos;
    if ((this->m_syncToStream & 1U) == 0) {
      return 1;
    }
  }
  puStack_48 = (this->super_AbstractStreamReader).m_curPos + 3;
  ppuVar6 = std::min<unsigned_char*>
                      (&stack0xffffffffffffffb8,&(this->super_AbstractStreamReader).m_bufEnd);
  local_40 = NALUnit::findNALWithStartCode
                       (*ppuVar6,(this->super_AbstractStreamReader).m_bufEnd,
                        (bool)(this->m_longCodesAllowed & 1));
  if (local_40 == (this->super_AbstractStreamReader).m_bufEnd) {
    storeBufferRest(this);
    return 1;
  }
  prevDts._4_4_ = bufFromNAL(this);
  if (prevDts._4_4_ != 0) {
    iStack_58 = this->m_curDts;
    this->m_shortStartCodes = prevDts._4_4_ < 4;
    while (nal_2._4_4_ = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                           _vptr_BaseAbstractStreamReader[0x1f])
                                   (this,(this->super_AbstractStreamReader).m_curPos + prevDts._4_4_
                                   ), nal_2._4_4_ == 5) {
      findEnd = NALUnit::findNALWithStartCode
                          ((this->super_AbstractStreamReader).m_curPos + prevDts._4_4_,
                           (this->super_AbstractStreamReader).m_bufEnd,
                           (bool)(this->m_longCodesAllowed & 1));
      this->m_processedBytes =
           (int64_t)(findEnd +
                    (this->m_processedBytes - (long)(this->super_AbstractStreamReader).m_curPos));
      (this->super_AbstractStreamReader).m_curPos = findEnd;
      nal_1 = findEnd;
      if (findEnd == (this->super_AbstractStreamReader).m_bufEnd) {
        nal_2._4_4_ = -10;
        this->m_syncToStream = false;
        break;
      }
      prevDts._4_4_ = bufFromNAL(this);
    }
    if (nal_2._4_4_ == -10) {
      storeBufferRest(this);
      this->m_lastDecodedPos = (uint8_t *)0x0;
      return 1;
    }
    if (iStack_58 != this->m_curDts) {
      *(int64_t *)prevPos = this->m_curPts + (this->super_AbstractStreamReader).m_timeOffset;
      lVar1 = this->m_curDts;
      lVar2 = (this->super_AbstractStreamReader).m_timeOffset;
      lVar3 = this->m_pcrIncPerFrame;
      iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x17])();
      *(long *)(prevPos + 8) = (lVar1 + lVar2) - lVar3 * iVar4;
      uVar5 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x1c])();
      if ((uVar5 & 1) != 0) {
        *(uint *)(prevPos + 0x20) = *(uint *)(prevPos + 0x20) | 8;
      }
      uVar5 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x11])(this,prevPos);
      if ((uVar5 & 1) != 0) {
        *(uint *)(prevPos + 0x20) = *(uint *)(prevPos + 0x20) | 0x10;
      }
      if ((this->m_spsPpsFound & 1U) != 0) {
        *(uint *)(prevPos + 0x20) = *(uint *)(prevPos + 0x20) | 0x20;
      }
      return 0;
    }
  }
  nal = (this->super_AbstractStreamReader).m_curPos + 0x8000;
  ppuVar6 = std::min<unsigned_char*>(&(this->super_AbstractStreamReader).m_bufEnd,&nal);
  local_70 = *ppuVar6;
  puVar7 = NALUnit::findNALWithStartCode
                     ((this->super_AbstractStreamReader).m_curPos + prevDts._4_4_,local_70,
                      (bool)(this->m_longCodesAllowed & 1));
  puStack_80 = puVar7;
  if (puVar7 == local_70) {
    if (((*puVar7 == '\x01') && (puVar7[-1] == '\0')) && (puVar7[-2] == '\0')) {
      puStack_80 = puVar7 + -2;
      if (puVar7[-3] == '\0') {
        puStack_80 = puVar7 + -3;
      }
    }
    else if (((*puVar7 == '\0') && (puVar7[-1] == '\0')) &&
            (puStack_80 = puVar7 + -1, puVar7[-2] == '\0')) {
      puStack_80 = puVar7 + -2;
    }
  }
  *(uint8_t **)(prevPos + 0x10) = (this->super_AbstractStreamReader).m_curPos;
  *(int *)(prevPos + 0x18) = (int)puStack_80 - (int)nal_1;
  *(int64_t *)prevPos = this->m_curPts + (this->super_AbstractStreamReader).m_timeOffset;
  lVar1 = this->m_curDts;
  lVar2 = (this->super_AbstractStreamReader).m_timeOffset;
  lVar3 = this->m_pcrIncPerFrame;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])();
  *(long *)(prevPos + 8) = (lVar1 + lVar2) - lVar3 * iVar4;
  uVar5 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x1c])();
  if ((uVar5 & 1) != 0) {
    *(uint *)(prevPos + 0x20) = *(uint *)(prevPos + 0x20) | 8;
  }
  uVar5 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x11])(this,prevPos);
  if ((uVar5 & 1) != 0) {
    *(uint *)(prevPos + 0x20) = *(uint *)(prevPos + 0x20) | 0x10;
  }
  if ((this->m_spsPpsFound & 1U) != 0) {
    *(uint *)(prevPos + 0x20) = *(uint *)(prevPos + 0x20) | 0x20;
  }
  (this->super_AbstractStreamReader).m_curPos = puStack_80;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  this->m_processedBytes = (long)*(int *)(prevPos + 0x18) + this->m_processedBytes;
  return 0;
}

Assistant:

int MPEGStreamReader::readPacket(AVPacket& avPacket)
{
    // LTRACE(LT_DEBUG, 0, "MPEGStreamReader::readPacket");
    avPacket.codec = this;
    avPacket.flags = m_flags;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;

    avPacket.duration = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back
    const uint8_t* prevPos = m_curPos;
    if (!m_syncToStream)
    {
        uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos, m_bufEnd, m_longCodesAllowed);
        if (nal != m_bufEnd)
        {
            m_syncToStream = true;
            m_curPos = nal;
        }
        else
            m_curPos = m_bufEnd;
        const int bytesProcessed = static_cast<int>(m_curPos - prevPos);
        m_processedBytes += bytesProcessed;
        prevPos = m_curPos;
        if (!m_syncToStream)
            return NEED_MORE_DATA;
    }

    const uint8_t* nextNal =
        NALUnit::findNALWithStartCode((std::min)(m_curPos + 3, m_bufEnd), m_bufEnd, m_longCodesAllowed);
    if (nextNal == m_bufEnd)
    {
        storeBufferRest();
        return NEED_MORE_DATA;
    }

    int isNal = bufFromNAL();
    if (isNal)
    {
        const int64_t prevDts = m_curDts;
        m_shortStartCodes = isNal < 4;
        int rez;
        while (true)
        {
            rez = decodeNal(m_curPos + isNal);
            if (rez != UNIT_SKIPPED)
                break;
            uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos + isNal, m_bufEnd, m_longCodesAllowed);
            // assert(nal < findEnd); // if unit is skipped, next unit MUST be in buffer

            m_processedBytes += nal - m_curPos;
            prevPos = m_curPos = nal;
            if (nal == m_bufEnd)
            {
                rez = NOT_ENOUGH_BUFFER;
                m_syncToStream = false;
                break;
            }
            isNal = bufFromNAL();
        }

        if (rez == NOT_ENOUGH_BUFFER)
        {
            storeBufferRest();
            m_lastDecodedPos = nullptr;
            return NEED_MORE_DATA;
        }
        if (prevDts != m_curDts)
        {
            // stream interleaving is allowed during one stream packet

            avPacket.pts = m_curPts + m_timeOffset;
            avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back to 1 frame;
            if (isIFrame())
                avPacket.flags |= AVPacket::IS_IFRAME;
            if (isPriorityData(&avPacket))
                avPacket.flags |= AVPacket::PRIORITY_DATA;
            if (m_spsPpsFound)
                avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

            return 0;  // return zero AV packet for new frame
        }
    }
    uint8_t* findEnd = (std::min)(m_bufEnd, m_curPos + MAX_AV_PACKET_SIZE);
    uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos + isNal, findEnd, m_longCodesAllowed);

    if (nal == findEnd)
    {
        if (nal[0] == 1 && nal[-1] == 0 && nal[-2] == 0)
        {
            nal -= 2;
            if (nal[-1] == 0)
                nal--;
        }
        else if (nal[0] == 0 && nal[-1] == 0)
        {
            nal--;
            if (nal[-1] == 0)
                nal--;
        }
    }

    const int bytesProcessed = static_cast<int>(nal - prevPos);
    avPacket.data = m_curPos;
    avPacket.size = bytesProcessed;
    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back
    if (isIFrame())
        avPacket.flags |= AVPacket::IS_IFRAME;
    if (isPriorityData(&avPacket))
        avPacket.flags |= AVPacket::PRIORITY_DATA;
    if (m_spsPpsFound)
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

    m_curPos = nal;

    m_tmpBufferLen = 0;
    m_processedBytes += avPacket.size;

    return 0;
}